

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
* __thiscall
ninx::lexer::Lexer::generate
          (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  Reader *this_00;
  pointer puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  _Head_base<0UL,_ninx::lexer::token::Token_*,_false> _Var6;
  iterator __begin2;
  pointer puVar7;
  bool lateSelectorFound;
  _Head_base<0UL,_ninx::lexer::token::Token_*,_false> local_88;
  undefined1 local_80 [4];
  int trailing_spaces;
  _Head_base<0UL,_ninx::lexer::token::Token_*,_false> local_78;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  tokens;
  
  tokens.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tokens.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->reader;
  do {
    iVar3 = Reader::get_next_limiter(this_00);
    puVar1 = tokens.
             super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3 == -1) {
      puVar7 = tokens.
               super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (this->verbose == true) {
        for (; puVar7 != puVar1; puVar7 = puVar7 + 1) {
          poVar5 = token::operator<<((ostream *)std::cout,
                                     (puVar7->_M_t).
                                     super___uniq_ptr_impl<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
                                     .super__Head_base<0UL,_ninx::lexer::token::Token_*,_false>.
                                     _M_head_impl);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
           tokens.
           super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           tokens.
           super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage =
           tokens.
           super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      tokens.
      super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tokens.
      super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tokens.
      super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
      ::~vector(&tokens);
      return __return_storage_ptr__;
    }
    if (iVar3 < 1) {
      trailing_spaces = Reader::get_line_number(this_00);
      Reader::read_until_limiter_abi_cxx11_((string *)&stack0xffffffffffffff88,this_00);
      std::make_unique<ninx::lexer::token::Text,int,std::__cxx11::string>
                ((int *)&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &trailing_spaces);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
      bVar2 = token::Text::is_empty((Text *)local_88._M_head_impl);
      _Var6._M_head_impl = local_88._M_head_impl;
      if (!bVar2) {
        local_88._M_head_impl = (Token *)0x0;
        local_78._M_head_impl = _Var6._M_head_impl;
        std::
        vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
        ::
        emplace_back<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>
                  ((vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
                    *)&tokens,
                   (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                    *)&stack0xffffffffffffff88);
        goto LAB_0012bec5;
      }
    }
    else {
      if (iVar3 == 0x24) {
        local_80 = (undefined1  [4])Reader::get_line_number(this_00);
        Reader::read_identifier_abi_cxx11_
                  ((string *)&stack0xffffffffffffff88,this_00,&trailing_spaces);
        std::make_unique<ninx::lexer::token::Variable,int,std::__cxx11::string>
                  ((int *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
        token::Variable::set_trailing_spaces((Variable *)local_88._M_head_impl,trailing_spaces);
        local_78._M_head_impl = local_88._M_head_impl;
        local_88._M_head_impl = (Token *)0x0;
        std::
        vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
        ::
        emplace_back<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>
                  ((vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
                    *)&tokens,
                   (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                    *)&stack0xffffffffffffff88);
      }
      else {
        if (iVar3 != 0x40) {
          iVar4 = Reader::get_line_number(this_00);
          local_88._M_head_impl._0_4_ = iVar4;
          trailing_spaces = CONCAT31(trailing_spaces._1_3_,(char)iVar3);
          std::make_unique<ninx::lexer::token::Limiter,int,char>
                    ((int *)&stack0xffffffffffffff88,(char *)&local_88);
          local_88._M_head_impl = local_78._M_head_impl;
          local_78._M_head_impl = (Token *)0x0;
          std::
          vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
          ::
          emplace_back<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>
                    ((vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
                      *)&tokens,
                     (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                      *)&local_88);
          _Var6._M_head_impl = local_78._M_head_impl;
          if ((Keyword *)local_88._M_head_impl != (Keyword *)0x0) {
            (*((Token *)&(local_88._M_head_impl)->_vptr_Token)->_vptr_Token[1])();
            _Var6._M_head_impl = local_78._M_head_impl;
          }
          goto LAB_0012bf2a;
        }
        lateSelectorFound = false;
        local_80 = (undefined1  [4])Reader::get_line_number(this_00);
        Reader::read_identifier_abi_cxx11_
                  ((string *)&stack0xffffffffffffff88,this_00,&trailing_spaces,0x3f,
                   &lateSelectorFound);
        std::make_unique<ninx::lexer::token::Keyword,int,std::__cxx11::string>
                  ((int *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
        if (lateSelectorFound == true) {
          token::Keyword::set_late((Keyword *)local_88._M_head_impl,true);
        }
        local_78._M_head_impl = local_88._M_head_impl;
        local_88._M_head_impl = (Token *)0x0;
        std::
        vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
        ::
        emplace_back<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>
                  ((vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
                    *)&tokens,
                   (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                    *)&stack0xffffffffffffff88);
      }
LAB_0012bec5:
      _Var6._M_head_impl = local_88._M_head_impl;
      if ((Keyword *)local_78._M_head_impl != (Keyword *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
        _Var6._M_head_impl = local_88._M_head_impl;
      }
    }
LAB_0012bf2a:
    if ((Keyword *)_Var6._M_head_impl != (Keyword *)0x0) {
      (*((Token *)&(_Var6._M_head_impl)->_vptr_Token)->_vptr_Token[1])();
    }
  } while( true );
}

Assistant:

std::vector<std::unique_ptr<Token>> ninx::lexer::Lexer::generate() {
    std::vector<std::unique_ptr<Token>> tokens;

    while(true) {
        int next_limiter = reader.get_next_limiter();
        if (next_limiter == -1) {  // EOF
            break;
        }

        if (next_limiter > 0) {  // A limiter was found
            switch (next_limiter) {
                case '@':  // Keyword beginning
                {
                    bool lateSelectorFound = false;
                    int trailing_spaces;
                    auto keywordToken = std::make_unique<Keyword>(reader.get_line_number(), reader.read_identifier(trailing_spaces, '?', lateSelectorFound));

                    if (lateSelectorFound) {
                        keywordToken->set_late(true);
                    }

                    tokens.push_back(std::move(keywordToken));
                    break;
                }
                case '$':  // Variable beginning
                {
                    int trailing_spaces;
                    auto variableToken = std::make_unique<Variable>(reader.get_line_number(),
                                                                    reader.read_identifier(trailing_spaces));
                    variableToken->set_trailing_spaces(trailing_spaces);
                    tokens.push_back(std::move(variableToken));
                    break;
                }
                default:   // Other limiters, mark them as generic limiters
                {
                    auto limiterToken = std::make_unique<Limiter>(reader.get_line_number(), static_cast<char>(next_limiter));
                    tokens.push_back(std::move(limiterToken));
                }
            }
        }else{  // A limiter was not found, it is a simple text
            auto token = std::make_unique<Text>(reader.get_line_number(), reader.read_until_limiter());
            // Only add non-empty tokens
            if (!token->is_empty()) {
                tokens.push_back(std::move(token));
            }
        }
    }

    if (verbose) {
        for (auto &token : tokens) {
            std::cout << *token << std::endl;
        }
    }

    return std::move(tokens);
}